

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O2

void bcwrite_proto(BCWriteCtx *ctx,GCproto *pt)

{
  double dVar1;
  char cVar2;
  uint uVar3;
  GCproto *pt_00;
  uint64_t uVar4;
  char *pcVar5;
  long *plVar6;
  uint uVar7;
  long lVar8;
  MSize MVar9;
  MSize sz;
  uint uVar10;
  MSize i;
  uint32_t uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  cTValue *pcVar15;
  char *pcVar16;
  int iVar17;
  uint local_4c;
  
  if ((pt->flags & 1) != 0) {
    uVar10 = pt->sizekgc;
    uVar4 = (pt->k).ptr64;
    for (lVar12 = 0; -lVar12 != (ulong)uVar10; lVar12 = lVar12 + -1) {
      pt_00 = *(GCproto **)((uVar4 - 8) + lVar12 * 8);
      if (pt_00->gct == '\a') {
        bcwrite_proto(ctx,pt_00);
      }
    }
  }
  MVar9 = (uint)pt->sizeuv * 2 + pt->sizebc * 4 + 0x23;
  pcVar5 = (ctx->sb).b;
  if ((uint)(*(int *)&(ctx->sb).e - (int)pcVar5) < MVar9) {
    pcVar5 = lj_buf_need2(&ctx->sb,MVar9);
  }
  pcVar5[5] = pt->flags & 7;
  pcVar5[6] = pt->numparams;
  pcVar5[7] = pt->framesize;
  pcVar5[8] = pt->sizeuv;
  pcVar5 = lj_strfmt_wuleb128(pcVar5 + 9,pt->sizekgc);
  pcVar5 = lj_strfmt_wuleb128(pcVar5,pt->sizekn);
  pcVar5 = lj_strfmt_wuleb128(pcVar5,pt->sizebc - 1);
  if (ctx->strip == 0) {
    uVar4 = (pt->lineinfo).ptr64;
    local_4c = 0;
    if (uVar4 != 0) {
      local_4c = ((int)pt - (int)uVar4) + pt->sizept;
    }
    pcVar5 = lj_strfmt_wuleb128(pcVar5,local_4c);
    if (local_4c != 0) {
      pcVar5 = lj_strfmt_wuleb128(pcVar5,pt->firstline);
      pcVar5 = lj_strfmt_wuleb128(pcVar5,pt->numline);
      goto LAB_001293a8;
    }
  }
  local_4c = 0;
LAB_001293a8:
  MVar9 = pt->sizebc;
  uVar14 = (ulong)(MVar9 * 4 - 4);
  memcpy(pcVar5,(void *)((long)&pt[1].nextgc.gcptr64 + 4),uVar14);
  if (((pt->flags & 0x10) != 0) || (pt->trace != 0)) {
    lVar12 = *(long *)(((ctx->sb).L.ptr64 & 0xfffffffffffffff8) + 0x10);
    for (lVar8 = 0; MVar9 - 1 != (int)lVar8; lVar8 = lVar8 + 1) {
      uVar10 = (byte)pcVar5[lVar8 * 4] - 0x4e;
      if (uVar10 < 10) {
        if ((0x125U >> (uVar10 & 0x1f) & 1) == 0) {
          if ((0x248U >> (uVar10 & 0x1f) & 1) != 0) {
            *(undefined4 *)(pcVar5 + lVar8 * 4) =
                 *(undefined4 *)
                  (*(long *)(*(long *)(lVar12 + 0x460) +
                            (ulong)*(ushort *)(pcVar5 + lVar8 * 4 + 2) * 8) + 0x50);
          }
        }
        else {
          pcVar5[lVar8 * 4] = pcVar5[lVar8 * 4] - 1;
        }
      }
    }
  }
  uVar13 = (ulong)((uint)pt->sizeuv * 2);
  memcpy(pcVar5 + uVar14,(void *)(pt->uv).ptr64,uVar13);
  (ctx->sb).w = pcVar5 + uVar14 + uVar13;
  uVar10 = pt->sizekgc;
  plVar6 = (long *)((pt->k).ptr64 + (ulong)uVar10 * -8);
  uVar7 = 0;
  do {
    if (uVar7 == uVar10) {
      MVar9 = pt->sizekn;
      uVar4 = (pt->k).ptr64;
      sz = MVar9 * 10;
      pcVar5 = (ctx->sb).w;
      if ((uint)(*(int *)&(ctx->sb).e - (int)pcVar5) < sz) {
        pcVar5 = lj_buf_more2(&ctx->sb,sz);
      }
      for (lVar12 = 0; MVar9 != (MSize)lVar12; lVar12 = lVar12 + 1) {
        dVar1 = *(double *)(uVar4 + lVar12 * 8);
        if ((dVar1 != (double)(int)dVar1) || (NAN(dVar1) || NAN((double)(int)dVar1))) {
          pcVar5 = lj_strfmt_wuleb128(pcVar5,(SUB84(dVar1,0) & 0x80000000 | SUB84(dVar1,0) * 2) + 1)
          ;
          iVar17 = *(int *)(uVar4 + lVar12 * 8);
          if (iVar17 < 0) {
            pcVar5[-1] = (byte)((uint)iVar17 >> 0x1b) & 0x18 | pcVar5[-1] & 7U;
          }
          pcVar5 = lj_strfmt_wuleb128(pcVar5,*(uint32_t *)(uVar4 + 4 + lVar12 * 8));
        }
        else {
          uVar10 = (uint)dVar1;
          pcVar5 = lj_strfmt_wuleb128(pcVar5,uVar10 & 0x80000000 | uVar10 * 2);
          if ((int)uVar10 < 0) {
            pcVar5[-1] = (byte)(uVar10 >> 0x1b) & 0x18 | pcVar5[-1] & 7U;
          }
        }
      }
      (ctx->sb).w = pcVar5;
      if (local_4c != 0) {
        if ((uint)(*(int *)&(ctx->sb).e - (int)pcVar5) < local_4c) {
          pcVar5 = lj_buf_more2(&ctx->sb,local_4c);
        }
        memcpy(pcVar5,(void *)(pt->lineinfo).ptr64,(ulong)local_4c);
        pcVar5 = pcVar5 + local_4c;
        (ctx->sb).w = pcVar5;
      }
      if (ctx->status == 0) {
        pcVar16 = (ctx->sb).b;
        iVar17 = (int)pcVar5 - (int)pcVar16;
        uVar10 = iVar17 - 5;
        uVar7 = 0x1f;
        if (uVar10 != 0) {
          for (; uVar10 >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        pcVar16 = pcVar16 + (5 - ((uVar7 ^ 0xffffffe0) * 9 + 0x168 >> 6));
        lj_strfmt_wuleb128(pcVar16,uVar10);
        iVar17 = (*ctx->wfunc)((lua_State *)((ctx->sb).L.ptr64 & 0xfffffffffffffff8),pcVar16,
                               (long)iVar17 + 0xfffffffb,ctx->wdata);
        ctx->status = iVar17;
      }
      return;
    }
    lVar12 = *plVar6;
    cVar2 = *(char *)(lVar12 + 9);
    if (cVar2 == '\n') {
      uVar11 = 2;
      MVar9 = 0x15;
      if (*(short *)(lVar12 + 10) != 0xb) {
        if (*(short *)(lVar12 + 10) == 0xc) {
          uVar11 = 3;
        }
        else {
          uVar11 = 4;
        }
      }
    }
    else if (cVar2 == '\a') {
      uVar11 = 0;
      MVar9 = 1;
    }
    else if (cVar2 == '\x04') {
      MVar9 = *(int *)(lVar12 + 0x14) + 5;
      uVar11 = MVar9;
    }
    else {
      MVar9 = 0xb;
      uVar11 = 1;
    }
    pcVar5 = (ctx->sb).w;
    if ((uint)(*(int *)&(ctx->sb).e - (int)pcVar5) < MVar9) {
      pcVar5 = lj_buf_more2(&ctx->sb,MVar9);
    }
    pcVar5 = lj_strfmt_wuleb128(pcVar5,uVar11);
    if (uVar11 < 5) {
      if (uVar11 == 0) goto LAB_001295a1;
      if (uVar11 != 1) {
        pcVar5 = lj_strfmt_wuleb128(pcVar5,*(uint32_t *)(lVar12 + 0x10));
        pcVar5 = lj_strfmt_wuleb128(pcVar5,*(uint32_t *)(lVar12 + 0x14));
        if (uVar11 == 4) {
          pcVar5 = lj_strfmt_wuleb128(pcVar5,*(uint32_t *)(lVar12 + 0x18));
          pcVar5 = lj_strfmt_wuleb128(pcVar5,*(uint32_t *)(lVar12 + 0x1c));
        }
        goto LAB_001295a1;
      }
      uVar11 = 0;
      uVar14 = 0;
      if ((ulong)*(uint *)(lVar12 + 0x30) != 0) {
        uVar13 = (ulong)*(uint *)(lVar12 + 0x30);
        do {
          uVar14 = uVar13;
          if ((long)uVar14 < 1) {
            uVar14 = 0;
            break;
          }
          uVar13 = uVar14 - 1;
        } while (*(long *)(*(long *)(lVar12 + 0x10) + -8 + uVar14 * 8) == -1);
      }
      if (*(int *)(lVar12 + 0x34) != 0) {
        uVar11 = 0;
        for (lVar8 = 0; (ulong)(*(int *)(lVar12 + 0x34) + 1) * 0x18 - lVar8 != 0;
            lVar8 = lVar8 + 0x18) {
          uVar11 = uVar11 + (*(long *)(*(long *)(lVar12 + 0x28) + lVar8) != -1);
        }
      }
      pcVar5 = lj_strfmt_wuleb128(pcVar5,(uint32_t)uVar14);
      pcVar5 = lj_strfmt_wuleb128(pcVar5,uVar11);
      (ctx->sb).w = pcVar5;
      if ((uint32_t)uVar14 != 0) {
        pcVar15 = *(cTValue **)(lVar12 + 0x10);
        while (iVar17 = (int)uVar14, uVar14 = (ulong)(iVar17 - 1), iVar17 != 0) {
          bcwrite_ktabk(ctx,pcVar15,1);
          pcVar15 = pcVar15 + 1;
        }
      }
      if (uVar11 != 0) {
        pcVar15 = (cTValue *)((ulong)*(uint *)(lVar12 + 0x34) * 0x18 + *(long *)(lVar12 + 0x28));
        do {
          if (pcVar15->u64 != 0xffffffffffffffff) {
            bcwrite_ktabk(ctx,pcVar15 + 1,0);
            bcwrite_ktabk(ctx,pcVar15,1);
            uVar11 = uVar11 - 1;
            if (uVar11 == 0) break;
          }
          pcVar15 = pcVar15 + -3;
        } while( true );
      }
    }
    else {
      uVar3 = *(uint *)(lVar12 + 0x14);
      memcpy(pcVar5,(void *)(lVar12 + 0x18),(ulong)uVar3);
      pcVar5 = pcVar5 + uVar3;
LAB_001295a1:
      (ctx->sb).w = pcVar5;
    }
    uVar7 = uVar7 + 1;
    plVar6 = plVar6 + 1;
  } while( true );
}

Assistant:

static void bcwrite_proto(BCWriteCtx *ctx, GCproto *pt)
{
  MSize sizedbg = 0;
  char *p;

  /* Recursively write children of prototype. */
  if ((pt->flags & PROTO_CHILD)) {
    ptrdiff_t i, n = pt->sizekgc;
    GCRef *kr = mref(pt->k, GCRef) - 1;
    for (i = 0; i < n; i++, kr--) {
      GCobj *o = gcref(*kr);
      if (o->gch.gct == ~LJ_TPROTO)
	bcwrite_proto(ctx, gco2pt(o));
    }
  }

  /* Start writing the prototype info to a buffer. */
  p = lj_buf_need(&ctx->sb,
		  5+4+6*5+(pt->sizebc-1)*(MSize)sizeof(BCIns)+pt->sizeuv*2);
  p += 5;  /* Leave room for final size. */

  /* Write prototype header. */
  *p++ = (pt->flags & (PROTO_CHILD|PROTO_VARARG|PROTO_FFI));
  *p++ = pt->numparams;
  *p++ = pt->framesize;
  *p++ = pt->sizeuv;
  p = lj_strfmt_wuleb128(p, pt->sizekgc);
  p = lj_strfmt_wuleb128(p, pt->sizekn);
  p = lj_strfmt_wuleb128(p, pt->sizebc-1);
  if (!ctx->strip) {
    if (proto_lineinfo(pt))
      sizedbg = pt->sizept - (MSize)((char *)proto_lineinfo(pt) - (char *)pt);
    p = lj_strfmt_wuleb128(p, sizedbg);
    if (sizedbg) {
      p = lj_strfmt_wuleb128(p, pt->firstline);
      p = lj_strfmt_wuleb128(p, pt->numline);
    }
  }

  /* Write bytecode instructions and upvalue refs. */
  p = bcwrite_bytecode(ctx, p, pt);
  p = lj_buf_wmem(p, proto_uv(pt), pt->sizeuv*2);
  ctx->sb.w = p;

  /* Write constants. */
  bcwrite_kgc(ctx, pt);
  bcwrite_knum(ctx, pt);

  /* Write debug info, if not stripped. */
  if (sizedbg) {
    p = lj_buf_more(&ctx->sb, sizedbg);
    p = lj_buf_wmem(p, proto_lineinfo(pt), sizedbg);
    ctx->sb.w = p;
  }

  /* Pass buffer to writer function. */
  if (ctx->status == 0) {
    MSize n = sbuflen(&ctx->sb) - 5;
    MSize nn = (lj_fls(n)+8)*9 >> 6;
    char *q = ctx->sb.b + (5 - nn);
    p = lj_strfmt_wuleb128(q, n);  /* Fill in final size. */
    lj_assertBCW(p == ctx->sb.b + 5, "bad ULEB128 write");
    ctx->status = ctx->wfunc(sbufL(&ctx->sb), q, nn+n, ctx->wdata);
  }
}